

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Refal2::CParser::parsingBlank(CParser *this)

{
  TParsingElementState TVar1;
  bool bVar2;
  TTokenType TVar3;
  code *pcVar4;
  
  TVar3 = (this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type;
  if (TVar3 == TT_Word) {
    bVar2 = CDirectiveParser::StartParseIfDirective(&this->super_CDirectiveParser);
    if (bVar2) {
      pcVar4 = parsingDirective;
      goto LAB_00127ce2;
    }
    TVar3 = (this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type;
  }
  if (TVar3 != TT_LineFeed) {
    bVar2 = CRuleParser::BeginRule((CRuleParser *)this);
    if (!bVar2) {
      pcVar4 = parsingIgnoreLine;
      goto LAB_00127ce2;
    }
    this->state = (TState)parsingRule;
    *(undefined8 *)&this->field_0x1f68 = 0;
    CRuleParser::AddToken((CRuleParser *)this);
    TVar1 = (this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.
            super_CParsingElementState.state;
    if (TVar1 == PES_Wrong) {
      this->state = (TState)parsingIgnoreLine;
      *(undefined8 *)&this->field_0x1f68 = 0;
      if ((this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type !=
          TT_LineFeed) {
        return;
      }
      this->state = (TState)parsingInitial;
      return;
    }
    if (TVar1 != PES_Correct) {
      return;
    }
  }
  pcVar4 = parsingInitial;
LAB_00127ce2:
  this->state = (TState)pcVar4;
  *(undefined8 *)&this->field_0x1f68 = 0;
  return;
}

Assistant:

void CParser::parsingBlank()
{
	if( token.type == TT_Word && CDirectiveParser::StartParseIfDirective() ) {
		state = &CParser::parsingDirective;
	} else if( token.type == TT_LineFeed ) {
		state = &CParser::parsingInitial;
	} else {
		if( !CRuleParser::BeginRule() ) {
			state = &CParser::parsingIgnoreLine;
			return;
		}
		state = &CParser::parsingRule;
		AddToken();
	}
}